

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void SplitRGBPlane(uint8_t *src_rgb,int src_stride_rgb,uint8_t *dst_r,int dst_stride_r,
                  uint8_t *dst_g,int dst_stride_g,uint8_t *dst_b,int dst_stride_b,int width,
                  int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SplitRGBRow;
  int y;
  uint in_stack_00000018;
  code *local_38;
  int local_30;
  long local_28;
  uint local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_38 = SplitRGBRow_C;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  if ((int)dst_r < 0) {
    dst_r._0_4_ = -(int)dst_r;
    local_18 = in_RDX + (int)(((int)dst_r + -1) * in_ECX);
    local_28 = in_R8 + (int)(((int)dst_r + -1) * in_R9D);
    _y = _y + (int)(((int)dst_r + -1) * (uint)dst_g);
    local_1c = -in_ECX;
    in_R9D = -in_R9D;
    dst_g._0_4_ = -(uint)dst_g;
  }
  local_c = in_ESI;
  if ((((in_ESI == in_stack_00000018 * 3) && (local_1c == in_stack_00000018)) &&
      (in_R9D == in_stack_00000018)) && ((uint)dst_g == in_stack_00000018)) {
    in_stack_00000018 = (int)dst_r * in_stack_00000018;
    dst_r._0_4_ = 1;
    dst_g._0_4_ = 0;
    in_R9D = 0;
    local_1c = 0;
    local_c = 0;
  }
  iVar1 = libyuv::TestCpuFlag(in_R9D);
  if ((iVar1 != 0) && (local_38 = SplitRGBRow_Any_SSSE3, (in_stack_00000018 & 0xf) == 0)) {
    local_38 = SplitRGBRow_SSSE3;
  }
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < (int)dst_r; local_30 = local_30 + 1) {
    (*local_38)(local_8,local_18,local_28,_y,in_stack_00000018);
    local_18 = local_18 + (int)local_1c;
    local_28 = local_28 + (int)in_R9D;
    _y = _y + (int)(uint)dst_g;
    local_8 = local_8 + local_c;
  }
  return;
}

Assistant:

LIBYUV_API
void SplitRGBPlane(const uint8_t* src_rgb,
                   int src_stride_rgb,
                   uint8_t* dst_r,
                   int dst_stride_r,
                   uint8_t* dst_g,
                   int dst_stride_g,
                   uint8_t* dst_b,
                   int dst_stride_b,
                   int width,
                   int height) {
  int y;
  void (*SplitRGBRow)(const uint8_t* src_rgb, uint8_t* dst_r, uint8_t* dst_g,
                      uint8_t* dst_b, int width) = SplitRGBRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_r = dst_r + (height - 1) * dst_stride_r;
    dst_g = dst_g + (height - 1) * dst_stride_g;
    dst_b = dst_b + (height - 1) * dst_stride_b;
    dst_stride_r = -dst_stride_r;
    dst_stride_g = -dst_stride_g;
    dst_stride_b = -dst_stride_b;
  }
  // Coalesce rows.
  if (src_stride_rgb == width * 3 && dst_stride_r == width &&
      dst_stride_g == width && dst_stride_b == width) {
    width *= height;
    height = 1;
    src_stride_rgb = dst_stride_r = dst_stride_g = dst_stride_b = 0;
  }
#if defined(HAS_SPLITRGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    SplitRGBRow = SplitRGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      SplitRGBRow = SplitRGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_SPLITRGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SplitRGBRow = SplitRGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      SplitRGBRow = SplitRGBRow_MMI;
    }
  }
#endif
#if defined(HAS_SPLITRGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SplitRGBRow = SplitRGBRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SplitRGBRow = SplitRGBRow_NEON;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    // Copy a row of RGB.
    SplitRGBRow(src_rgb, dst_r, dst_g, dst_b, width);
    dst_r += dst_stride_r;
    dst_g += dst_stride_g;
    dst_b += dst_stride_b;
    src_rgb += src_stride_rgb;
  }
}